

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  Session *in_stack_00000090;
  int result;
  Session *this;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  int in_stack_fffffffffffffe64;
  ParserBase in_stack_fffffffffffffe68;
  
  std::operator<<((ostream *)&std::cout,"macros defined:\n");
  this = (Session *)&stack0xfffffffffffffe68;
  Catch::Session::Session(in_stack_00000090);
  iVar1 = Catch::Session::run<char>
                    ((Session *)in_stack_fffffffffffffe68._vptr_ParserBase,in_stack_fffffffffffffe64
                     ,(char **)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  Catch::Session::~Session(this);
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
    std::cout << "macros defined:\n";
#ifdef _WIN32
    std::cout << "_WIN32 defined\n";
#endif

#ifdef __CYGWIN__
    std::cout << "__CYGWIN__ defined\n";
#endif

#ifdef __APPLE__
    std::cout << "__APPLE__ defined\n";
#endif

    // your existing setup...
    int result = Catch::Session().run(argc, argv);

    // your existing clean-up...
    return result;
}